

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocumentlayout.cpp
# Opt level: O2

void __thiscall
QTextDocumentLayoutPrivate::drawListItem
          (QTextDocumentLayoutPrivate *this,QPointF *offset,QPainter *painter,PaintContext *context,
          QTextBlock *bl,QTextCharFormat *selectionFormat)

{
  QAbstractTextDocumentLayout *this_00;
  Data *pDVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  undefined8 uVar4;
  bool bVar5;
  Style SVar6;
  int iVar7;
  LayoutDirection LVar8;
  int iVar9;
  MarkerType MVar10;
  QPaintDevice *pQVar11;
  QTextObject *this_01;
  QTextLayout *this_02;
  QPoint QVar12;
  QPoint QVar13;
  QBrush *pQVar14;
  QPen *pQVar15;
  long in_FS_OFFSET;
  undefined4 uVar16;
  undefined4 uVar17;
  double dVar18;
  double dVar19;
  QTextLine QVar20;
  QColor QVar21;
  QPointF QVar22;
  double local_1c8;
  undefined8 local_168;
  QPointF local_158 [3];
  QBrush local_128 [2];
  QTextLayout layout;
  QBrush brush;
  undefined1 *local_108;
  QTextEngine *local_100;
  QArrayDataPointer<char16_t> local_f8;
  QFontMetrics fontMetrics;
  QTextOption option;
  QBrush fg;
  QRectF local_98;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QAbstractTextDocumentLayout **)
             &(this->super_QAbstractTextDocumentLayoutPrivate).field_0x8;
  local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QTextBlock::blockFormat((QTextBlock *)local_48);
  local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QTextBlock::charFormat((QTextBlock *)local_58);
  local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QTextCharFormat::font((QTextCharFormat *)local_68);
  pQVar11 = QAbstractTextDocumentLayout::paintDevice(this_00);
  if (pQVar11 != (QPaintDevice *)0x0) {
    pQVar11 = QAbstractTextDocumentLayout::paintDevice(this_00);
    QFont::QFont((QFont *)&local_98,(QFont *)local_68,pQVar11);
    uVar4 = local_68._0_8_;
    local_68._0_8_ = local_98.xp;
    uVar16 = local_68._8_4_;
    local_68._8_4_ = local_98.yp._0_4_;
    local_98.yp._0_4_ = uVar16;
    local_98.xp = (qreal)uVar4;
    QFont::~QFont((QFont *)&local_98);
  }
  fontMetrics.d.d.ptr = (QExplicitlySharedDataPointer<QFontPrivate>)&DAT_aaaaaaaaaaaaaaaa;
  QFontMetrics::QFontMetrics(&fontMetrics,(QFont *)local_68);
  this_01 = QTextDocument::objectForFormat
                      ((this->super_QAbstractTextDocumentLayoutPrivate).document,
                       (QTextFormat *)local_48);
  local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QTextObject::format((QTextObject *)&local_98);
  QTextFormat::toListFormat((QTextFormat *)local_78);
  QTextFormat::~QTextFormat((QTextFormat *)&local_98);
  SVar6 = QTextListFormat::style((QTextListFormat *)local_78);
  local_f8.d = (Data *)0x0;
  local_f8.ptr = (char16_t *)0x0;
  local_f8.size = 0;
  bVar5 = QTextFormat::hasProperty((QTextFormat *)local_48,0x3000);
  if (bVar5) {
    SVar6 = QTextFormat::intProperty((QTextFormat *)local_48,0x3000);
  }
  this_02 = QTextBlock::layout(bl);
  iVar7 = QTextLayout::lineCount(this_02);
  if (iVar7 == 0) {
LAB_00473dc3:
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_f8);
    QTextFormat::~QTextFormat((QTextFormat *)local_78);
    QFontMetrics::~QFontMetrics(&fontMetrics);
    QFont::~QFont((QFont *)local_68);
    QTextFormat::~QTextFormat((QTextFormat *)local_58);
    QTextFormat::~QTextFormat((QTextFormat *)local_48);
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
      __stack_chk_fail();
    }
    return;
  }
  local_108 = &DAT_aaaaaaaaaaaaaaaa;
  QVar20 = QTextLayout::lineAt(this_02,0);
  local_100 = QVar20.eng;
  local_108 = (undefined1 *)CONCAT44(local_108._4_4_,QVar20.index);
  QVar22 = QTextLayout::position(this_02);
  dVar18 = QVar22.yp + offset->yp;
  local_98.yp._0_4_ = SUB84(dVar18,0);
  local_98.xp = QVar22.xp + offset->xp;
  local_98.yp._4_4_ = (int)((ulong)dVar18 >> 0x20);
  QVar12 = QPointF::toPoint((QPointF *)&local_98);
  LVar8 = QTextBlock::textDirection(bl);
  local_98.w = -NAN;
  local_98.h = -NAN;
  local_98.yp._0_4_ = 0xffffffff;
  local_98.xp = -NAN;
  local_98.yp._4_4_ = 0xffffffff;
  QTextLine::naturalTextRect(&local_98,(QTextLine *)&local_108);
  fg.d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
  super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
  super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl = (DataPtr)(DataPtr)local_98.xp;
  QVar13 = QPointF::toPoint((QPointF *)&fg);
  if (LVar8 == RightToLeft) {
    uVar16 = SUB84(local_98.w,0);
    uVar17 = (undefined4)((ulong)local_98.w >> 0x20);
  }
  else {
    uVar16 = 0;
    uVar17 = 0x80000000;
  }
  if ((uint)(SVar6 + 8) < 5) {
    QTextList::itemText((QString *)&local_98,(QTextList *)this_01,bl);
    qVar3 = local_f8.size;
    pcVar2 = local_f8.ptr;
    pDVar1 = local_f8.d;
    local_f8.d = (Data *)local_98.xp;
    local_f8.ptr = (char16_t *)local_98.yp;
    local_98.yp = (qreal)pcVar2;
    local_98.xp = (qreal)pDVar1;
    local_f8.size = (qsizetype)local_98.w;
    local_98.w = (qreal)qVar3;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
    iVar7 = QFontMetrics::horizontalAdvance(&fontMetrics,(QString *)&local_f8,-1);
    iVar9 = QFontMetrics::height(&fontMetrics);
    dVar19 = (double)iVar9;
    dVar18 = (double)iVar7;
  }
  else {
    if (2 < (uint)(SVar6 + ~ListDecimal)) goto LAB_00473dc3;
    iVar7 = QFontMetrics::lineSpacing(&fontMetrics);
    dVar19 = (double)(iVar7 / 3);
    dVar18 = dVar19;
  }
  local_168 = (double)CONCAT44(uVar17,uVar16);
  local_98.w = dVar18;
  local_98.h = dVar19;
  iVar7 = QFontMetrics::horizontalAdvance(&fontMetrics,(QChar)0x20);
  local_1c8 = (double)iVar7;
  if (LVar8 == LeftToRight) {
    local_1c8 = -local_1c8 - dVar18;
  }
  iVar7 = QFontMetrics::height(&fontMetrics);
  dVar18 = dVar19 * -0.5 + (double)(iVar7 / 2) +
           (double)QVar12.yp.m_i.m_i + (double)QVar13.yp.m_i.m_i;
  local_98.yp._0_4_ = SUB84(dVar18,0);
  local_98.xp = local_1c8 + (double)QVar13.xp.m_i.m_i + (double)QVar12.xp.m_i.m_i + local_168;
  local_98.yp._4_4_ = (int)((ulong)dVar18 >> 0x20);
  QPainter::save(painter);
  QPainter::setRenderHint(painter,Antialiasing,true);
  QTextBlock::blockFormat((QTextBlock *)&fg);
  MVar10 = QTextBlockFormat::marker((QTextBlockFormat *)&fg);
  QTextFormat::~QTextFormat((QTextFormat *)&fg);
  if (selectionFormat == (QTextCharFormat *)0x0) {
    fg.d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
    super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
    super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl = (DataPtr)&DAT_aaaaaaaaaaaaaaaa;
    QTextFormat::foreground((QTextFormat *)&fg);
    bVar5 = QBrush::doCompareEqualStyle(&fg,NoBrush);
    if (bVar5) {
      pQVar14 = QPalette::text(&context->palette);
      QBrush::operator=(&fg,pQVar14);
    }
    QPen::QPen((QPen *)&option,&fg,0.0,SolidLine,SquareCap,BevelJoin);
    QPainter::setPen(painter,(QPen *)&option);
    QPen::~QPen((QPen *)&option);
    QBrush::~QBrush(&fg);
LAB_004739a5:
    brush.d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
    super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
    super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl = (DataPtr)&DAT_aaaaaaaaaaaaaaaa;
    pQVar14 = QPalette::brush(&context->palette,Text);
    QBrush::QBrush(&brush,pQVar14);
    if (MVar10 == NoMarker) goto LAB_00473c55;
  }
  else {
    QTextFormat::foreground((QTextFormat *)&option);
    QPen::QPen((QPen *)&fg,(QBrush *)&option,0.0,SolidLine,SquareCap,BevelJoin);
    QPainter::setPen(painter,(QPen *)&fg);
    QPen::~QPen((QPen *)&fg);
    QBrush::~QBrush((QBrush *)&option);
    if (MVar10 == NoMarker) {
      QTextFormat::background((QTextFormat *)&fg);
      QPainter::fillRect(painter,&local_98,&fg);
      QBrush::~QBrush(&fg);
      goto LAB_004739a5;
    }
    brush.d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
    super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
    super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl = (DataPtr)&DAT_aaaaaaaaaaaaaaaa;
    pQVar14 = QPalette::brush(&context->palette,Text);
    QBrush::QBrush(&brush,pQVar14);
  }
  iVar7 = QFontMetrics::lineSpacing(&fontMetrics);
  dVar18 = (double)-(iVar7 / 6) + local_98.xp;
  local_98.yp = local_98.yp + 0.0;
  local_98.xp = dVar18;
  local_98.w = local_98.w + 0.0;
  local_98.h = local_98.h + 0.0;
  fg.d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
  super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
  super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl = (DataPtr)(dVar18 + (double)-(iVar7 / 6))
  ;
  if (selectionFormat != (QTextCharFormat *)0x0) {
    QTextFormat::background((QTextFormat *)&option);
    QPainter::fillRect(painter,(QRectF *)&fg,(QBrush *)&option);
    QBrush::~QBrush((QBrush *)&option);
  }
  QTextBlock::blockFormat((QTextBlock *)&option);
  MVar10 = QTextBlockFormat::marker((QTextBlockFormat *)&option);
  QTextFormat::~QTextFormat((QTextFormat *)&option);
  if (MVar10 == Checked) {
    pQVar15 = QPainter::pen(painter);
    QVar21 = QPen::color(pQVar15);
    option._0_8_ = QVar21._0_8_;
    option.tab._0_6_ = QVar21.ct._4_6_;
    QBrush::QBrush(local_128,(QColor *)&option,SolidPattern);
    QPen::QPen((QPen *)local_158,local_128,2.0,SolidLine,SquareCap,BevelJoin);
    QPainter::setPen(painter,(QPen *)local_158);
    QPen::~QPen((QPen *)local_158);
    QBrush::~QBrush(local_128);
    option._0_8_ = local_98.xp;
    option.tab = local_98.yp;
    local_158[0].yp._0_4_ = SUB84(local_98.yp + local_98.h,0);
    local_158[0].xp = local_98.xp + local_98.w;
    local_158[0].yp._4_4_ = (int)((ulong)(local_98.yp + local_98.h) >> 0x20);
    QPainter::drawLine(painter,(QPointF *)&option,local_158);
    option._0_8_ = local_98.w + local_98.xp;
    option.tab = local_98.yp;
    local_158[0].yp = local_98.yp + local_98.h;
    local_158[0].xp = local_98.xp;
    QPainter::drawLine(painter,(QPointF *)&option,local_158);
    pQVar15 = QPainter::pen(painter);
    QVar21 = QPen::color(pQVar15);
    option._0_8_ = QVar21._0_8_;
    option.tab._0_6_ = QVar21.ct._4_6_;
    QBrush::QBrush(local_128,(QColor *)&option,SolidPattern);
    QPen::QPen((QPen *)local_158,local_128,0.0,SolidLine,SquareCap,BevelJoin);
    QPainter::setPen(painter,(QPen *)local_158);
    QPen::~QPen((QPen *)local_158);
    QBrush::~QBrush(local_128);
  }
  QPainter::drawRect(painter,(QRectF *)&fg);
LAB_00473c55:
  (*(code *)(&DAT_005fb620 + *(int *)(&DAT_005fb620 + (ulong)(uint)(SVar6 + 8) * 4)))();
  return;
}

Assistant:

void QTextDocumentLayoutPrivate::drawListItem(const QPointF &offset, QPainter *painter,
                                              const QAbstractTextDocumentLayout::PaintContext &context,
                                              const QTextBlock &bl, const QTextCharFormat *selectionFormat) const
{
    Q_Q(const QTextDocumentLayout);
    const QTextBlockFormat blockFormat = bl.blockFormat();
    const QTextCharFormat charFormat = bl.charFormat();
    QFont font(charFormat.font());
    if (q->paintDevice())
        font = QFont(font, q->paintDevice());

    const QFontMetrics fontMetrics(font);
    QTextObject * const object = document->objectForFormat(blockFormat);
    const QTextListFormat lf = object->format().toListFormat();
    int style = lf.style();
    QString itemText;
    QSizeF size;

    if (blockFormat.hasProperty(QTextFormat::ListStyle))
        style = QTextListFormat::Style(blockFormat.intProperty(QTextFormat::ListStyle));

    QTextLayout *layout = bl.layout();
    if (layout->lineCount() == 0)
        return;
    QTextLine firstLine = layout->lineAt(0);
    Q_ASSERT(firstLine.isValid());
    QPointF pos = (offset + layout->position()).toPoint();
    Qt::LayoutDirection dir = bl.textDirection();
    {
        QRectF textRect = firstLine.naturalTextRect();
        pos += textRect.topLeft().toPoint();
        if (dir == Qt::RightToLeft)
            pos.rx() += textRect.width();
    }

    switch (style) {
    case QTextListFormat::ListDecimal:
    case QTextListFormat::ListLowerAlpha:
    case QTextListFormat::ListUpperAlpha:
    case QTextListFormat::ListLowerRoman:
    case QTextListFormat::ListUpperRoman:
        itemText = static_cast<QTextList *>(object)->itemText(bl);
        size.setWidth(fontMetrics.horizontalAdvance(itemText));
        size.setHeight(fontMetrics.height());
        break;

    case QTextListFormat::ListSquare:
    case QTextListFormat::ListCircle:
    case QTextListFormat::ListDisc:
        size.setWidth(fontMetrics.lineSpacing() / 3);
        size.setHeight(size.width());
        break;

    case QTextListFormat::ListStyleUndefined:
        return;
    default: return;
    }

    QRectF r(pos, size);

    qreal xoff = fontMetrics.horizontalAdvance(u' ');
    if (dir == Qt::LeftToRight)
        xoff = -xoff - size.width();
    r.translate( xoff, (fontMetrics.height() / 2) - (size.height() / 2));

    painter->save();

    painter->setRenderHint(QPainter::Antialiasing);

    const bool marker = bl.blockFormat().marker() != QTextBlockFormat::MarkerType::NoMarker;
    if (selectionFormat) {
        painter->setPen(QPen(selectionFormat->foreground(), 0));
        if (!marker)
            painter->fillRect(r, selectionFormat->background());
    } else {
        QBrush fg = charFormat.foreground();
        if (fg == Qt::NoBrush)
            fg = context.palette.text();
        painter->setPen(QPen(fg, 0));
    }

    QBrush brush = context.palette.brush(QPalette::Text);

    if (marker) {
        int adj = fontMetrics.lineSpacing() / 6;
        r.adjust(-adj, 0, -adj, 0);
        const QRectF outer = r.adjusted(-adj, -adj, adj, adj);
        if (selectionFormat)
            painter->fillRect(outer, selectionFormat->background());
        if (bl.blockFormat().marker() == QTextBlockFormat::MarkerType::Checked) {
            // ### Qt7: render with QStyle / PE_IndicatorCheckBox. We don't currently
            // have access to that here, because it would be a widget dependency.
            painter->setPen(QPen(painter->pen().color(), 2));
            painter->drawLine(r.topLeft(), r.bottomRight());
            painter->drawLine(r.topRight(), r.bottomLeft());
            painter->setPen(QPen(painter->pen().color(), 0));
        }
        painter->drawRect(outer);
    }

    switch (style) {
    case QTextListFormat::ListDecimal:
    case QTextListFormat::ListLowerAlpha:
    case QTextListFormat::ListUpperAlpha:
    case QTextListFormat::ListLowerRoman:
    case QTextListFormat::ListUpperRoman: {
        QTextLayout layout(itemText, font, q->paintDevice());
        layout.setCacheEnabled(true);
        QTextOption option(Qt::AlignLeft | Qt::AlignAbsolute);
        option.setTextDirection(dir);
        layout.setTextOption(option);
        layout.beginLayout();
        QTextLine line = layout.createLine();
        if (line.isValid())
            line.setLeadingIncluded(true);
        layout.endLayout();
        layout.draw(painter, QPointF(r.left(), pos.y()));
        break;
    }
    case QTextListFormat::ListSquare:
        if (!marker)
            painter->fillRect(r, painter->pen().brush());
        break;
    case QTextListFormat::ListCircle:
        if (!marker)
            painter->drawEllipse(r.translated(0.5, 0.5)); // pixel align for sharper rendering
        break;
    case QTextListFormat::ListDisc:
        if (!marker) {
            painter->setBrush(painter->pen().brush());
            painter->setPen(Qt::NoPen);
            painter->drawEllipse(r);
        }
        break;
    case QTextListFormat::ListStyleUndefined:
        break;
    default:
        break;
    }

    painter->restore();
}